

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O3

Value * __thiscall
(anonymous_namespace)::
fromStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          (Value *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *in)

{
  string *psVar1;
  Value *pVVar2;
  Value *extraout_RAX;
  Value *extraout_RAX_00;
  string *value;
  Value VStack_48;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  psVar1 = *(string **)(this + 8);
  pVVar2 = extraout_RAX;
  for (value = *(string **)this; value != psVar1; value = value + 1) {
    Json::Value::Value(&VStack_48,value);
    Json::Value::append(__return_storage_ptr__,&VStack_48);
    Json::Value::~Value(&VStack_48);
    pVVar2 = extraout_RAX_00;
  }
  return pVVar2;
}

Assistant:

Json::Value fromStringList(const T& in)
{
  Json::Value result = Json::arrayValue;
  for (std::string const& i : in) {
    result.append(i);
  }
  return result;
}